

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

int AF_AActor_UnlinkFromWorld
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  bool bVar1;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (AActor *)(param->field_0).field_1.a;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (bVar1) {
      AActor::UnlinkFromWorld(this,(FLinkContext *)0x0);
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x18d,
                "int AF_AActor_UnlinkFromWorld(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, UnlinkFromWorld)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->UnlinkFromWorld(nullptr); // fixme
	return 0;
}